

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939spy.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined3 uVar1;
  int iVar2;
  int extraout_EAX;
  void *pvVar3;
  ulong uVar4;
  int *piVar5;
  cmsghdr *__cmsg;
  tm *ptVar6;
  ulong uVar7;
  uint uVar8;
  char **ppcVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  undefined8 uVar16;
  size_t local_a8;
  ulong uStack_a0;
  size_t local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  j1939_filter filt;
  uint64_t dst_name;
  sockaddr_can local_48;
  
  iVar2 = s.time;
  do {
    while( true ) {
      while( true ) {
        while (s.time = iVar2, iVar2 = getopt_long(argc,argv,"vPb:t::?",long_opts,0), iVar2 == 0x50)
        {
          s.promisc = s.promisc + 1;
          iVar2 = s.time;
        }
        if (iVar2 != 0x62) break;
        uVar4 = strtoul(_optarg,(char **)0x0,0);
        s.pkt_len = (int)uVar4;
        iVar2 = s.time;
      }
      if (iVar2 != 0x74) {
        if (iVar2 != -1) {
          fputs("j1939spy: An SAE J1939 spy utility\nUsage: j1939spy [OPTION...] [[IFACE:][NAME|SA][,PGN]]\nOptions:\n  -P, --promisc\t\tRun in promiscuous mode\n\t\t\t(= receive traffic not for this ECU)\n  -b, --block=SIZE\tUse a receive buffer of SIZE (default 1024)\n  -t, --time[=a|d|z|A]\tShow time: (a)bsolute, (d)elta, (z)ero, (A)bsolute w date\n"
                ,_stderr);
          exit(1);
        }
        pcVar10 = argv[_optind];
        if ((pcVar10 != (char *)0x0) &&
           (_optarg = pcVar10, iVar2 = libj1939_str2addr(pcVar10,(char **)0x0,&s.addr), iVar2 < 0))
        {
          pcVar11 = "bad URI %s";
          uVar16 = 0;
          pcVar10 = _optarg;
          goto LAB_001029ea;
        }
        argc = s.pkt_len;
        buf = (uint8_t *)malloc((long)s.pkt_len);
        if (buf == (uint8_t *)0x0) {
          pcVar10 = "malloc %u";
          uVar16 = 1;
          iVar2 = argc;
          goto LAB_0010295c;
        }
        argc = socket(0x1d,2,7);
        if (-1 < argc) {
          filt.pgn = 0;
          filt.pgn_mask = 0;
          filt.addr = '\0';
          filt.addr_mask = '\0';
          filt._26_6_ = 0;
          filt.name = 0;
          filt.name_mask = 0;
          if (s.addr.can_addr.j1939.name != 0) {
            filt.name = s.addr.can_addr.j1939.name;
            filt.name_mask = 0xffffffffffffffff;
          }
          if (s.addr.can_addr.j1939.addr == 0xff) {
            uVar16 = s.addr.can_addr.tp;
            if (0x3ffff < s.addr.can_addr.j1939.pgn) goto LAB_00102963;
          }
          else {
            filt.addr_mask = 0xff;
            filt.addr = s.addr.can_addr.j1939.addr;
            filt._26_6_ = 0;
            if (0x3ffff < s.addr.can_addr.j1939.pgn) goto LAB_001024ef;
          }
          filt.pgn_mask = 0xffffffff;
          filt.pgn = s.addr.can_addr.j1939.pgn;
          goto LAB_001024ef;
        }
        pcVar10 = "socket(can, dgram, j1939)";
        goto LAB_00102a01;
      }
      if (_optarg != (char *)0x0) break;
      s.time = 0x7a;
      iVar2 = s.time;
    }
    iVar2 = (int)*_optarg;
    pvVar3 = memchr("adzA",iVar2,5);
  } while (pvVar3 != (void *)0x0);
  pcVar10 = "unknown time option \'%c\'";
  uVar16 = 1;
LAB_0010295c:
  do {
    uVar16 = err(uVar16,pcVar10,iVar2);
LAB_00102963:
    if (uVar16 != 0) {
LAB_001024ef:
      iVar2 = setsockopt(argc,0x6b,1,&filt,0x20);
      if (iVar2 < 0) {
        pcVar10 = "setsockopt filter";
        goto LAB_00102a01;
      }
    }
    if ((s.promisc != 0) && (iVar2 = setsockopt(argc,0x6b,2,&ival_1,4), iVar2 < 0))
    goto LAB_001029f1;
    if ((s.time != 0) && (iVar2 = setsockopt(argc,1,0x1d,&ival_1,4), iVar2 < 0)) {
      pcVar10 = "setsockopt timestamp";
LAB_00102a01:
      iVar2 = err(1,pcVar10);
      if (saved != (if_nameindex *)0x0) {
        if_freenameindex((if_nameindex *)saved);
        iVar2 = extraout_EAX;
      }
      saved = (if_nameindex *)0x0;
      return iVar2;
    }
    iVar2 = setsockopt(argc,1,8,&s.pkt_len,4);
    if (iVar2 < 0) {
      pcVar10 = "setsockopt rcvbuf %u";
      iVar2 = s.pkt_len;
    }
    else {
      local_48.can_addr.tp.rx_id = 0;
      local_48.can_addr.tp.tx_id = 0;
      local_48._0_8_ = (ulong)(uint)s.addr.can_ifindex << 0x20;
      local_48.can_family = 0x1d;
      local_48.can_addr._8_8_ = 0xff00040000;
      iVar2 = bind(argc,(sockaddr *)&local_48,0x18);
      if (iVar2 < 0) {
        pcVar11 = "bind(%s)";
        uVar16 = 1;
        pcVar10 = argv[1];
LAB_001029ea:
        err(uVar16,pcVar11,pcVar10);
LAB_001029f1:
        pcVar10 = "setsockopt promisc";
        goto LAB_00102a01;
      }
      iov.iov_base = buf;
      msg.msg_iov = &iov;
      msg.msg_iovlen = 1;
      msg.msg_control = ctrlmsg;
      local_90 = 0;
      local_98 = 0;
      msg.msg_name = &local_48;
      do {
        while( true ) {
          iov.iov_len = (size_t)s.pkt_len;
          msg.msg_namelen = 0x18;
          msg.msg_controllen = 0x68;
          msg.msg_flags = 0;
          uVar4 = recvmsg(argc,(msghdr *)&msg,0);
          uVar14 = (uint)uVar4;
          if ((int)uVar14 < 0) break;
          uVar15 = 0;
          __cmsg = (cmsghdr *)0x0;
          if (0xf < msg.msg_controllen) {
            __cmsg = (cmsghdr *)msg.msg_control;
          }
          local_80 = 0;
          local_88 = 0;
          for (; cmsg = (cmsghdr *)__cmsg, __cmsg != (cmsghdr *)0x0;
              __cmsg = __cmsg_nxthdr((msghdr *)&msg,__cmsg)) {
            if (__cmsg->cmsg_level == 0x6b) {
              uVar8 = __cmsg->cmsg_type;
              uVar15 = uVar15 | 1L << ((ulong)uVar8 & 0x3f);
              uVar1 = (undefined3)(uVar8 >> 8);
              if (uVar8 == 3) {
                local_80 = (ulong)CONCAT31(uVar1,(char)__cmsg[1].cmsg_len);
              }
              else if (uVar8 == 2) {
                memcpy(&dst_name,__cmsg + 1,__cmsg->cmsg_len - 0x10);
              }
              else if (uVar8 == 1) {
                local_88 = (ulong)CONCAT31(uVar1,(char)__cmsg[1].cmsg_len);
              }
            }
            else if ((__cmsg->cmsg_level == 1) && (__cmsg->cmsg_type == 0x1d)) {
              local_a8 = __cmsg[1].cmsg_len;
              uStack_a0._0_4_ = __cmsg[1].cmsg_level;
              uStack_a0._4_4_ = __cmsg[1].cmsg_type;
              uVar15 = uVar15 | 1L << ((ulong)(byte)__cmsg->cmsg_type & 0x3f);
            }
          }
          if (((uint)uVar15 >> 0x1d & 1) != 0) {
            if (s.time == 0x41) {
              ptVar6 = localtime((time_t *)&local_a8);
              printf("(%04u%02u%02uT%02u%02u%02u.%04llu)",(ulong)(ptVar6->tm_year + 0x76c),
                     (ulong)(ptVar6->tm_mon + 1),(ulong)(uint)ptVar6->tm_mday,
                     (ulong)(uint)ptVar6->tm_hour,(ulong)(uint)ptVar6->tm_min,
                     (ulong)(uint)ptVar6->tm_sec,uStack_a0 / 100);
            }
            else {
              if (s.time == 0x7a) {
                if (local_98 == 0) {
                  local_98 = local_a8;
                  local_90 = uStack_a0;
                }
                uVar7 = uStack_a0 - local_90;
                local_a8 = ((long)uVar7 >> 0x3f) + (local_a8 - local_98);
                uStack_a0 = uVar7 + 1000000;
                if (-1 < (long)uVar7) {
                  uStack_a0 = uVar7;
                }
              }
              else if (s.time == 100) {
                lVar12 = local_a8 - local_98;
                uVar13 = uStack_a0 - local_90;
                uVar7 = uVar13 + 1000000;
                if (-1 < (long)uVar13) {
                  uVar7 = uVar13;
                }
                local_90 = uStack_a0;
                local_98 = local_a8;
                local_a8 = ((long)uVar13 >> 0x3f) + lVar12;
                uStack_a0 = uVar7;
              }
              else if (s.time != 0x61) goto LAB_0010284f;
              printf("(%llu.%04llu)",local_a8,uStack_a0 / 100);
            }
          }
LAB_0010284f:
          pcVar10 = libj1939_addr2str(&local_48);
          printf(" %s ",pcVar10);
          if ((uVar15 & 4) == 0) {
            if ((uVar15 & 2) == 0) {
              printf("- ");
            }
            else {
              printf("%02x ",local_88 & 0xff);
            }
          }
          else {
            printf("%016llx ",dst_name);
          }
          argv = (char **)0x0;
          printf("!%u ",local_80 & 0xff);
          pcVar10 = "...";
          if ((msg.msg_flags & 0x20U) == 0) {
            pcVar10 = "";
          }
          printf("[%i%s]",uVar4 & 0xffffffff,pcVar10);
          while ((uint)argv < uVar14) {
            uVar8 = (uint)argv + 4;
            ppcVar9 = (char **)(ulong)uVar8;
            if (uVar14 <= uVar8) {
              ppcVar9 = (char **)(uVar4 & 0xffffffff);
            }
            putchar(0x20);
            for (argv = (char **)((ulong)argv & 0xffffffff); argv < ppcVar9;
                argv = (char **)((long)argv + 1)) {
              printf("%02x",(ulong)buf[(long)argv]);
            }
          }
          putchar(10);
        }
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
      iVar2 = s.addr.can_ifindex;
      if (*piVar5 == 100) {
        pcVar10 = "ifindex %i";
        uVar16 = 0;
        goto LAB_0010295c;
      }
      pcVar10 = "recvmsg(ifindex %i)";
    }
    uVar16 = 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int ret, sock, opt;
	unsigned int j, len;
	struct timeval tref, tdut, ttmp;
	struct sockaddr_can src;
	struct j1939_filter filt;
	int filter = 0;
	uint8_t priority, dst_addr;
	uint64_t dst_name;
	uint64_t recvflags;

	/* argument parsing */
	while ((opt = getopt_long(argc, argv, optstring, long_opts, NULL)) != -1)
		switch (opt) {
		case 'b':
			s.pkt_len = strtoul(optarg, 0, 0);
			break;
		case 'P':
			++s.promisc;
			break;
		case 't':
			if (optarg) {
				if (!strchr("adzA", optarg[0]))
					err(1, "unknown time option '%c'",
					    optarg[0]);
				s.time = optarg[0];
			} else {
				s.time = 'z';
			}
			break;
		default:
			fputs(help_msg, stderr);
			exit(1);
			break;
		}

	if (argv[optind]) {
		optarg = argv[optind];
		ret = libj1939_str2addr(optarg, 0, &s.addr);
		if (ret < 0) {
			err(0, "bad URI %s", optarg);
			return 1;
		}
	}

	buf = malloc(s.pkt_len);
	if (!buf)
		err(1, "malloc %u", s.pkt_len);

	/* setup socket */
	sock = socket(PF_CAN, SOCK_DGRAM, CAN_J1939);
	if (sock < 0)
		err(1, "socket(can, dgram, j1939)");

	memset(&filt, 0, sizeof(filt));
	if (s.addr.can_addr.j1939.name) {
		filt.name = s.addr.can_addr.j1939.name;
		filt.name_mask = ~0ULL;
		++filter;
	}
	if (s.addr.can_addr.j1939.addr < 0xff) {
		filt.addr = s.addr.can_addr.j1939.addr;
		filt.addr_mask = ~0;
		++filter;
	}
	if (s.addr.can_addr.j1939.pgn <= J1939_PGN_MAX) {
		filt.pgn = s.addr.can_addr.j1939.pgn;
		filt.pgn_mask = ~0;
		++filter;
	}
	if (filter) {
		ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_FILTER, &filt, sizeof(filt));
		if (ret < 0)
			err(1, "setsockopt filter");
	}

	if (s.promisc) {
		ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_PROMISC, &ival_1, sizeof(ival_1));
		if (ret < 0)
			err(1, "setsockopt promisc");
	}

	if (s.time) {
		ret = setsockopt(sock, SOL_SOCKET, SO_TIMESTAMP, &ival_1, sizeof(ival_1));
		if (ret < 0)
			err(1, "setsockopt timestamp");
	}
	ret = setsockopt(sock, SOL_SOCKET, SO_RCVBUF, &s.pkt_len, sizeof(s.pkt_len));
	if (ret < 0)
		err(1, "setsockopt rcvbuf %u", s.pkt_len);

	/* bind(): to default, only ifindex is used. */
	memset(&src, 0, sizeof(src));
	src.can_ifindex = s.addr.can_ifindex;
	src.can_family = AF_CAN;
	src.can_addr.j1939.name = J1939_NO_NAME;
	src.can_addr.j1939.addr = J1939_NO_ADDR;
	src.can_addr.j1939.pgn = J1939_NO_PGN;
	ret = bind(sock, (void *)&src, sizeof(src));
	if (ret < 0)
		err(1, "bind(%s)", argv[1]);

	/* these settings are static and can be held out of the hot path */
	iov.iov_base = &buf[0];
	msg.msg_name = &src;
	msg.msg_iov = &iov;
	msg.msg_iovlen = 1;
	msg.msg_control = &ctrlmsg;

	memset(&tref, 0, sizeof(tref));
	while (1) {
		/* these settings may be modified by recvmsg() */
		iov.iov_len = s.pkt_len;
		msg.msg_namelen = sizeof(src);
		msg.msg_controllen = sizeof(ctrlmsg);
		msg.msg_flags = 0;

		ret = recvmsg(sock, &msg, 0);
		//ret = recvfrom(buf, s.pkt_len, 0, (void *)&addr, &len);
		if (ret < 0) {
			switch (errno) {
			case ENETDOWN:
				err(0, "ifindex %i", s.addr.can_ifindex);
				continue;
			case EINTR:
				continue;
			default:
				err(1, "recvmsg(ifindex %i)", s.addr.can_ifindex);
				break;
			}
		}
		len = ret;
		recvflags = 0;
		dst_addr = 0;
		priority = 0;
		for (cmsg = CMSG_FIRSTHDR(&msg); cmsg; cmsg = CMSG_NXTHDR(&msg, cmsg)) {
			switch (cmsg->cmsg_level) {
			case SOL_SOCKET:
				if (cmsg->cmsg_type == SCM_TIMESTAMP) {
					memcpy(&tdut, CMSG_DATA(cmsg), sizeof(tdut));
					recvflags |= 1ULL << cmsg->cmsg_type;
				}
				break;
			case SOL_CAN_J1939:
				recvflags |= 1ULL << cmsg->cmsg_type;
				if (cmsg->cmsg_type == SCM_J1939_DEST_ADDR)
					dst_addr = *CMSG_DATA(cmsg);
				else if (cmsg->cmsg_type == SCM_J1939_DEST_NAME)
					memcpy(&dst_name, CMSG_DATA(cmsg), cmsg->cmsg_len - CMSG_LEN(0));
				else if (cmsg->cmsg_type == SCM_J1939_PRIO)
					priority = *CMSG_DATA(cmsg);
				break;
			}

		}
		if (recvflags & (1ULL << SCM_TIMESTAMP)) {
			if ('z' == s.time) {
				if (!tref.tv_sec)
					tref = tdut;
				timersub(&tdut, &tref, &ttmp);
				tdut = ttmp;
				goto abs_time;
			} else if ('d' == s.time) {
				timersub(&tdut, &tref, &ttmp);
				tref = tdut;
				tdut = ttmp;
				goto abs_time;
			} else if ('a' == s.time) {
abs_time:
				printf("(%llu.%04llu)", (unsigned long long)tdut.tv_sec, (unsigned long long)tdut.tv_usec / 100);
			} else if ('A' == s.time) {
				struct tm tm;
				tm = *localtime(&tdut.tv_sec);
				printf("(%04u%02u%02uT%02u%02u%02u.%04llu)",
					tm.tm_year + 1900, tm.tm_mon + 1, tm.tm_mday,
					tm.tm_hour, tm.tm_min, tm.tm_sec,
					(unsigned long long)tdut.tv_usec/100);
			}
		}
		printf(" %s ", libj1939_addr2str(&src));
		if (recvflags & (1ULL << SCM_J1939_DEST_NAME))
			printf("%016llx ", (unsigned long long)dst_name);
		else if (recvflags & (1ULL << SCM_J1939_DEST_ADDR))
			printf("%02x ", dst_addr);
		else
			printf("- ");
		printf("!%u ", priority);

		printf("[%i%s]", len, (msg.msg_flags & MSG_TRUNC) ? "..." : "");
		for (j = 0; j < len;) {
			unsigned int end = j + 4;
			if (end > len)
				end = len;
			printf(" ");
			for (; j < end; ++j)
				printf("%02x", buf[j]);
		}
		printf("\n");
	}

	free(buf);
	return 0;
}